

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateSmallDenseSeeds.cpp
# Opt level: O1

int main(void)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [16];
  bool bVar3;
  uint16_t d_seed;
  atomic<unsigned_int> aVar4;
  int iVar5;
  WirehairResult WVar6;
  uint32_t block_bytes;
  long lVar7;
  uint64_t uVar8;
  ostream *poVar9;
  long *plVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  uint i;
  uint block_id;
  ulong uVar17;
  ulong uVar18;
  undefined4 uVar19;
  uint uVar20;
  uint16_t *puVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  Codec decoder;
  Codec encoder;
  Codec codec;
  __atomic_base<unsigned_int> local_fc6c;
  uint local_fc68;
  uint local_fc60;
  int local_fc5c;
  Codec local_fc38;
  Codec local_fb38;
  Codec local_fa38 [250];
  
  kTinyDenseCounts[0x40] = '\x13';
  kTinyDenseCounts[0] = '\0';
  kTinyDenseCounts[1] = '\0';
  kTinyDenseCounts[2] = '\x02';
  kTinyDenseCounts[3] = '\x03';
  kTinyDenseCounts[4] = '\x03';
  kTinyDenseCounts[5] = '\x05';
  kTinyDenseCounts[6] = '\x06';
  kTinyDenseCounts[7] = '\x06';
  kTinyDenseCounts[8] = '\x06';
  kTinyDenseCounts[9] = '\a';
  kTinyDenseCounts[10] = '\t';
  kTinyDenseCounts[0xb] = '\n';
  kTinyDenseCounts[0xc] = '\n';
  kTinyDenseCounts[0xd] = '\n';
  kTinyDenseCounts[0xe] = '\f';
  kTinyDenseCounts[0xf] = '\x0e';
  kTinyDenseCounts[0x10] = '\r';
  kTinyDenseCounts[0x11] = '\x0e';
  kTinyDenseCounts[0x12] = '\f';
  kTinyDenseCounts[0x13] = '\f';
  kTinyDenseCounts[0x14] = '\x0f';
  kTinyDenseCounts[0x15] = '\x10';
  kTinyDenseCounts[0x16] = '\x15';
  kTinyDenseCounts[0x17] = '\x0e';
  kTinyDenseCounts[0x18] = '\x0e';
  kTinyDenseCounts[0x19] = '\r';
  kTinyDenseCounts[0x1a] = '\x12';
  kTinyDenseCounts[0x1b] = '\x15';
  kTinyDenseCounts[0x1c] = '\x16';
  kTinyDenseCounts[0x1d] = '\x15';
  kTinyDenseCounts[0x1e] = '\r';
  kTinyDenseCounts[0x1f] = '\x16';
  kTinyDenseCounts[0x20] = '\r';
  kTinyDenseCounts[0x21] = '\x18';
  kTinyDenseCounts[0x22] = '\x0e';
  kTinyDenseCounts[0x23] = '\x11';
  kTinyDenseCounts[0x24] = '\x10';
  kTinyDenseCounts[0x25] = '\x18';
  kTinyDenseCounts[0x26] = '\x1e';
  kTinyDenseCounts[0x27] = '\x1a';
  kTinyDenseCounts[0x28] = '\x18';
  kTinyDenseCounts[0x29] = '\x12';
  kTinyDenseCounts[0x2a] = '\x0f';
  kTinyDenseCounts[0x2b] = '\x0f';
  kTinyDenseCounts[0x2c] = '\x18';
  kTinyDenseCounts[0x2d] = '\x12';
  kTinyDenseCounts[0x2e] = '\x15';
  kTinyDenseCounts[0x2f] = '\x11';
  kTinyDenseCounts[0x30] = '\x0e';
  kTinyDenseCounts[0x31] = '\x10';
  kTinyDenseCounts[0x32] = '\x15';
  kTinyDenseCounts[0x33] = '\x12';
  kTinyDenseCounts[0x34] = '\x11';
  kTinyDenseCounts[0x35] = '\x16';
  kTinyDenseCounts[0x36] = '\x19';
  kTinyDenseCounts[0x37] = '\x14';
  kTinyDenseCounts[0x38] = '\x11';
  kTinyDenseCounts[0x39] = '\x12';
  kTinyDenseCounts[0x3a] = '\x15';
  kTinyDenseCounts[0x3b] = '\x12';
  kTinyDenseCounts[0x3c] = '\x17';
  kTinyDenseCounts[0x3d] = '\x14';
  kTinyDenseCounts[0x3e] = '\x13';
  kTinyDenseCounts[0x3f] = '\x17';
  auVar24 = vmovdqu64_avx512f(wirehair::kTinyDenseSeeds._0_64_);
  auVar25 = vmovdqu64_avx512f(wirehair::kTinyDenseSeeds._64_64_);
  kTinyDenseSeeds._0_64_ = vmovdqu64_avx512f(auVar24);
  kTinyDenseSeeds._64_64_ = vmovdqu64_avx512f(auVar25);
  kTinyDenseSeeds[0x40] = 0x76e;
  memcpy(kSmallDenseSeeds,wirehair::kSmallDenseSeeds,0x7bf);
  memcpy(kSmallPeelSeeds,wirehair::kSmallPeelSeeds,0x800);
  iVar5 = gf256_init_(2);
  if (iVar5 == 0) {
    auVar24 = vmovdqa64_avx512f(_DAT_00109040);
    lVar7 = 0;
    auVar25 = vpbroadcastb_avx512bw(ZEXT116(0x40));
    do {
      auVar1 = vmovdqu64_avx512f(auVar24);
      *(undefined1 (*) [64])(Message + lVar7) = auVar1;
      lVar7 = lVar7 + 0x40;
      auVar24 = vpaddb_avx512bw(auVar24,auVar25);
    } while (lVar7 != 64000);
    local_fc5c = 0;
    local_fc6c._M_i = 10000;
    iVar5 = 0xb;
    uVar8 = siamese::GetTimeUsec();
    local_fc60 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"For N = ",8);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," trying count = ",0x10);
      plVar10 = (long *)std::ostream::operator<<(poVar9,iVar5);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
      uVar17 = uVar8 * -0x4f5c17a566d501a4 + 0x8f5dc87e5c07d8a;
      uVar14 = uVar8 * -0x7e9ce66163b5a5d2 + 0x4214a66dea6f8745;
      uVar11 = 0;
      do {
        uVar8 = uVar8 + 1;
        LOCK();
        FailedTrials.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
        UNLOCK();
        lVar7 = 0xdac;
        uVar15 = uVar14;
        uVar18 = uVar17;
        do {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar18;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar15;
          auVar26 = vpunpcklqdq_avx(auVar26,auVar23);
          auVar23 = vpsrlvq_avx2(auVar26,_DAT_00109090);
          auVar2 = vpsrlvq_avx2(auVar26,_DAT_001090a0);
          auVar23 = vpshufd_avx(auVar2 ^ auVar23,0xe8);
          auVar26 = vpsrlq_avx(auVar26,0x3b);
          auVar26 = vpshufd_avx(auVar26,0xe8);
          auVar26 = vprorvd_avx512vl(auVar23,auVar26);
          auVar23 = vpshufd_avx(auVar26,0x55);
          uVar19 = vpextrw_avx(auVar26 ^ auVar23,0);
          wirehair::Codec::Codec(local_fa38);
          wirehair::Codec::OverrideSeeds
                    (local_fa38,(uint16_t)iVar5,(uint16_t)uVar19,(uint16_t)uVar11);
          WVar6 = wirehair::Codec::InitializeEncoder(local_fa38,0x11,1);
          if ((WVar6 != Wirehair_Success) ||
             (WVar6 = wirehair::Codec::EncodeFeed(local_fa38,Message), WVar6 != Wirehair_Success)) {
            LOCK();
            FailedTrials.super___atomic_base<unsigned_int>._M_i =
                 (__atomic_base<unsigned_int>)
                 ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + 1);
            UNLOCK();
          }
          wirehair::Codec::~Codec(local_fa38);
          aVar4 = FailedTrials;
          uVar18 = uVar18 + 0x5851f42d4c957f2d;
          uVar15 = uVar15 + 0x685f98a2018fade9;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
        bVar22 = (int)FailedTrials.super___atomic_base<unsigned_int>._M_i < (int)local_fc6c._M_i;
        if (bVar22) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"*** New best dense: N = ",0x18);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,": Best dense seed = ",0x14);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", best count = ",0xf);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", best failures = ",0x12);
          plVar10 = (long *)std::ostream::operator<<
                                      (poVar9,(int)aVar4.super___atomic_base<unsigned_int>._M_i);
          std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
          std::ostream::put((char)plVar10);
          std::ostream::flush();
          local_fc6c = aVar4.super___atomic_base<unsigned_int>._M_i;
          local_fc60 = uVar11;
          local_fc5c = iVar5;
        }
        if (bVar22 && (int)aVar4.super___atomic_base<unsigned_int>._M_i < 1) break;
        uVar17 = uVar17 + 0xb0a3e85a992afe5c;
        uVar14 = uVar14 + 0x8163199e9c4a5a2e;
        bVar22 = uVar11 < 0xffff;
        uVar11 = uVar11 + 1;
      } while (bVar22);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0x10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"N = ",4);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": Best dense seed = ",0x14);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_fc60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", best count = ",0xf);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_fc5c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,", best failures = ",0x12);
    plVar10 = (long *)std::ostream::operator<<(poVar9,local_fc6c._M_i);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    local_fc6c._M_i = 100000;
    d_seed = (uint16_t)local_fc60;
    local_fc68 = 0;
    uVar11 = 0;
LAB_00101840:
    LOCK();
    FailedTrials.super___atomic_base<unsigned_int>._M_i = (__atomic_base<unsigned_int>)0;
    UNLOCK();
    uVar13 = 0;
    uVar12 = uVar13;
LAB_0010185f:
    wirehair::Codec::Codec(&local_fb38);
    wirehair::Codec::Codec(&local_fc38);
    wirehair::Codec::OverrideSeeds(&local_fb38,(uint16_t)local_fc5c,(uint16_t)uVar11,d_seed);
    wirehair::Codec::OverrideSeeds(&local_fc38,(uint16_t)local_fc5c,(uint16_t)uVar11,d_seed);
    WVar6 = wirehair::Codec::InitializeEncoder(&local_fb38,0x11,1);
    if ((WVar6 == Wirehair_Success) &&
       (WVar6 = wirehair::Codec::EncodeFeed(&local_fb38,Message), WVar6 == Wirehair_Success)) {
      WVar6 = wirehair::Codec::InitializeDecoder(&local_fc38,0x11,1);
      if (WVar6 == Wirehair_Success) {
        uVar20 = 0;
        iVar5 = 0;
        block_id = 0;
        do {
          if (uVar13 != block_id && uVar12 != block_id) {
            block_bytes = wirehair::Codec::Encode(&local_fb38,block_id,local_fa38,1);
            if (block_bytes == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Encode failed",0xd);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
              std::ostream::put('h');
              std::ostream::flush();
LAB_00101a63:
              LOCK();
              FailedTrials.super___atomic_base<unsigned_int>._M_i =
                   (__atomic_base<unsigned_int>)
                   ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + 10000);
              UNLOCK();
              bVar22 = false;
LAB_00101a70:
              bVar3 = false;
            }
            else {
              WVar6 = wirehair::Codec::DecodeFeed(&local_fc38,block_id,local_fa38,block_bytes);
              if (WVar6 == Wirehair_NeedMore) {
                if (0x1b < block_id) goto LAB_00101a63;
                bVar22 = true;
                goto LAB_00101a70;
              }
              if (WVar6 != Wirehair_Success) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"DecodeFeed failed",0x11);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
                std::ostream::put('h');
                std::ostream::flush();
                goto LAB_00101a63;
              }
              bVar3 = true;
              if (uVar20 != 0x10) {
                if (uVar20 == 0x12) {
                  iVar5 = 3;
                }
                else if (uVar20 == 0x11) {
                  iVar5 = 1;
                }
                else if (0x13 < uVar20 + 1) {
                  iVar5 = uVar20 * 3 + -0x30;
                }
              }
              bVar22 = false;
            }
            uVar20 = uVar20 + 1;
            if (!bVar22) goto LAB_00101a97;
          }
          block_id = block_id + 1;
        } while( true );
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"InitializeDecoder failed",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    goto LAB_00101b55;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"GF256 init failed",0x11)
  ;
  iVar5 = -1;
  goto LAB_0010233a;
LAB_00101a97:
  if (bVar3) {
    LOCK();
    FailedTrials.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + iVar5);
    UNLOCK();
    WVar6 = wirehair::Codec::ReconstructOutput(&local_fc38,local_fa38,0x11);
    lVar7 = 0x18;
    pcVar16 = "ReconstructOutput failed";
    if (WVar6 == Wirehair_Success) {
      auVar23 = vpternlogq_avx512vl(ZEXT116((byte)local_fa38[0]._d_seed ^ Message[0x10]),
                                    local_fa38[0]._0_16_,Message._0_16_,0xf6);
      lVar7 = 0xd;
      pcVar16 = "memcmp failed";
      if (auVar23 == (undefined1  [16])0x0) goto LAB_00101b60;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar16,lVar7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
LAB_00101b55:
    LOCK();
    FailedTrials.super___atomic_base<unsigned_int>._M_i =
         (__atomic_base<unsigned_int>)
         ((int)FailedTrials.super___atomic_base<unsigned_int>._M_i + 10000);
    UNLOCK();
  }
LAB_00101b60:
  wirehair::Codec::~Codec(&local_fc38);
  wirehair::Codec::~Codec(&local_fb38);
  aVar4 = FailedTrials;
  uVar13 = uVar13 + 1;
  if ((uVar13 != 0x11) || (uVar13 = uVar12 + 1, uVar12 = uVar13, uVar13 != 0x11)) goto LAB_0010185f;
  bVar22 = (int)FailedTrials.super___atomic_base<unsigned_int>._M_i < (int)local_fc6c._M_i;
  if (bVar22) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"*** New best peel: N = ",0x17);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": Best peel seed = ",0x13);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," fails = ",9);
    plVar10 = (long *)std::ostream::operator<<
                                (poVar9,(int)aVar4.super___atomic_base<unsigned_int>._M_i);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
    local_fc6c = aVar4.super___atomic_base<unsigned_int>._M_i;
    local_fc68 = uVar11;
  }
  if ((!bVar22 || 0 < (int)aVar4.super___atomic_base<unsigned_int>._M_i) &&
     (bVar22 = uVar11 < 0xffff, uVar11 = uVar11 + 1, bVar22)) goto LAB_00101840;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"N = ",4);
  poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,": Best peel seed = ",0x13);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_fc68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," fails = ",9);
  plVar10 = (long *)std::ostream::operator<<(poVar9,local_fc6c._M_i);
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  kTinyDenseCounts[0x11] = (uint8_t)local_fc5c;
  kTinyDenseSeeds[0x11] = d_seed;
  kSmallPeelSeeds[0x11] = (uint8_t)local_fc68;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"static const unsigned kTinyTableCount = ",0x28);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"static const unsigned kSmallTableCount = ",0x29);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,";",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const uint8_t kTinyDenseCounts[kTinyTableCount] = {",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  uVar14 = 0;
  do {
    if ((uVar14 & 0x1f) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
    }
    poVar9 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,(uint)kTinyDenseCounts[uVar14]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    uVar14 = uVar14 + 1;
    if ((uVar14 & 0x1f) == 0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
  } while (uVar14 != 0x41);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  poVar9 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"};",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  plVar10 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const uint16_t kTinyDenseSeeds[kTinyTableCount] = {",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  puVar21 = kTinyDenseSeeds;
  uVar14 = 0;
  do {
    if ((uVar14 & 0x1f) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
    }
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)*puVar21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    uVar14 = uVar14 + 1;
    if ((uVar14 & 0x1f) == 0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
    puVar21 = puVar21 + 1;
  } while (uVar14 != 0x41);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  poVar9 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"};",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  poVar9 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"// This table skips the first kTinyTableCount elements",0x36);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const uint8_t kSmallDenseSeeds[kSmallTableCount] = {",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  uVar14 = 0;
  do {
    if ((uVar14 & 0x1f) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
    }
    poVar9 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,(uint)kSmallDenseSeeds[uVar14]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    uVar14 = uVar14 + 1;
    if ((uVar14 & 0x1f) == 0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
  } while (uVar14 != 0x7bf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  poVar9 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"};",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  plVar10 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "const uint8_t kSmallPeelSeeds[kTinyTableCount + kSmallTableCount] = {",0x45);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  uVar14 = 0;
  do {
    if ((uVar14 & 0x1f) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
    }
    poVar9 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,(uint)kSmallPeelSeeds[uVar14]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
    uVar14 = uVar14 + 1;
    if ((uVar14 & 0x1f) == 0) {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
    }
  } while (uVar14 != 0x800);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"};",2);
  iVar5 = 0;
LAB_0010233a:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return iVar5;
}

Assistant:

void FillTables()
{
    memcpy(kTinyDenseCounts, wirehair::kTinyDenseCounts, sizeof(kTinyDenseCounts));
    memcpy(kTinyDenseSeeds, wirehair::kTinyDenseSeeds, sizeof(kTinyDenseSeeds));
    memcpy(kSmallDenseSeeds, wirehair::kSmallDenseSeeds, sizeof(kSmallDenseSeeds));
    memcpy(kSmallPeelSeeds, wirehair::kSmallPeelSeeds, sizeof(kSmallPeelSeeds));
}